

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_oct
          (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  uint uVar1;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_00;
  bin_writer<3> f;
  bool bVar2;
  uint num_digits_00;
  int iVar3;
  string_view prefix;
  undefined4 uStack_2c;
  uint num_digits;
  int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  num_digits_00 =
       basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
       int_writer<long_long,fmt::v5::basic_format_specs<char>>::count_digits<3u>
                 ((int_writer<long_long,fmt::v5::basic_format_specs<char>> *)this);
  bVar2 = basic_format_specs<char>::flag(this->spec,8);
  if ((bVar2) &&
     (iVar3 = basic_format_specs<char>::precision(this->spec), iVar3 <= (int)num_digits_00)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  this_00 = this->writer;
  prefix = get_prefix(this);
  f._12_4_ = uStack_2c;
  f.num_digits = num_digits_00;
  f.abs_value = this->abs_value;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this_00,num_digits_00,prefix,this->spec,f);
  return;
}

Assistant:

void on_oct() {
      unsigned num_digits = count_digits<3>();
      if (spec.flag(HASH_FLAG) &&
          spec.precision() <= static_cast<int>(num_digits)) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }